

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddDirectoryItem(cmComputeLinkInformation *this,string *item)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_49;
  string local_48;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_48,"APPLE",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  if (bVar1) {
    bVar1 = cmSystemTools::IsPathToFramework((char *)0x3ececb);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      AddFrameworkItem(this,item);
      return;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_48);
  }
  DropDirectoryItem(this,item);
  return;
}

Assistant:

void cmComputeLinkInformation::AddDirectoryItem(std::string const& item)
{
  if(this->Makefile->IsOn("APPLE")
     && cmSystemTools::IsPathToFramework(item.c_str()))
    {
    this->AddFrameworkItem(item);
    }
  else
    {
    this->DropDirectoryItem(item);
    }
}